

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

void priest_talk(monst *priest)

{
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  long offer;
  long pmoney;
  boolean strayed;
  boolean coaligned;
  monst *priest_local;
  
  bVar1 = p_coaligned(priest);
  bVar8 = u.ualign.record < 0;
  u.uconduct.gnostic = u.uconduct.gnostic + 1;
  if (((*(uint *)&priest->field_0x60 >> 0x10 & 1) != 0) ||
     ((((*(uint *)&priest->field_0x60 >> 0x1c & 1) == 0 && (bVar1 != '\0')) && (bVar8)))) {
    pcVar4 = Monnam(priest);
    pline("%s doesn\'t want anything to do with you!",pcVar4);
    *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xffbfffff;
  }
  else {
    bVar2 = histemple_at(priest,priest->mx,priest->my);
    if (((bVar2 == '\0') || ((*(uint *)&priest->field_0x60 >> 0x16 & 1) == 0)) ||
       (((*(uint *)&priest->field_0x60 >> 0x12 & 1) == 0 ||
        ((*(uint *)&priest->field_0x60 >> 0x13 & 1) != 0)))) {
      if (((*(uint *)&priest->field_0x60 >> 0x12 & 1) == 0) ||
         ((*(uint *)&priest->field_0x60 >> 0x13 & 1) != 0)) {
        pcVar4 = Monnam(priest);
        iVar3 = pronoun_gender(level,priest);
        pline("%s breaks out of %s reverie!",pcVar4,genders[iVar3].his);
        *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xfff7ffff;
        priest->mfrozen = '\0';
        *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xfffbffff | 0x40000;
      }
      *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xffbfffff;
      iVar3 = rn2(3);
      verbalize(priest_talk::cranky_msg[iVar3]);
    }
    else if ((((*(uint *)&priest->field_0x60 >> 0x16 & 1) == 0) ||
             (pcVar4 = in_rooms(level,priest->mx,priest->my,10), *pcVar4 == '\0')) ||
            (bVar2 = has_shrine(priest), bVar2 != '\0')) {
      lVar5 = money_cnt(invent);
      if (lVar5 == 0) {
        if ((bVar1 == '\0') || (bVar8)) {
          pcVar4 = Monnam(priest);
          pline("%s is not interested.",pcVar4);
        }
        else {
          lVar5 = money_cnt(priest->minvent);
          if (lVar5 < 1) {
            pcVar4 = Monnam(priest);
            pline("%s preaches the virtues of poverty.",pcVar4);
          }
          else {
            pcVar4 = Monnam(priest);
            pcVar7 = "two bits";
            if (lVar5 == 1) {
              pcVar7 = "one bit";
            }
            pline("%s gives you %s for an ale.",pcVar4,pcVar7);
            iVar3 = 1;
            if (1 < lVar5) {
              iVar3 = 2;
            }
            money2u(priest,(long)iVar3);
          }
          exercise(2,'\x01');
        }
      }
      else {
        pcVar4 = Monnam(priest);
        pline("%s asks you for a contribution for the temple.",pcVar4);
        lVar5 = bribe(priest);
        if (lVar5 == 0) {
          verbalize("Thou shalt regret thine action!");
          if (bVar1 != '\0') {
            adjalign(-1);
          }
        }
        else if (lVar5 < u.ulevel * 200) {
          lVar6 = money_cnt(invent);
          if (lVar6 == lVar5 * 2 || SBORROW8(lVar6,lVar5 * 2) != lVar6 + lVar5 * -2 < 0) {
            verbalize("I thank thee for thy contribution.");
            exercise(2,'\x01');
          }
          else {
            verbalize("Cheapskate.");
          }
        }
        else if (lVar5 < u.ulevel * 400) {
          verbalize("Thou art indeed a pious individual.");
          lVar6 = money_cnt(invent);
          if (SBORROW8(lVar6,lVar5 * 2) != lVar6 + lVar5 * -2 < 0) {
            if ((bVar1 != '\0') && (u.ualign.record < -3)) {
              adjalign(1);
            }
            verbalize("I bestow upon thee a blessing.");
            iVar3 = rn2(500);
            incr_itimeout(&u.uprops[0x2e].intrinsic,(long)(iVar3 + 500));
          }
        }
        else if (((lVar5 < u.ulevel * 600) && (u.ublessed < 0x14)) &&
                ((u.ublessed < 9 || (iVar3 = rn2(u.ublessed), iVar3 == 0)))) {
          verbalize("Thy devotion has been rewarded.");
          if ((u.uprops[0x16].intrinsic & 0x7000000) == 0) {
            u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic | 0x4000000;
            if (u.ublessed == 0) {
              iVar3 = rn2(3);
              u.ublessed = iVar3 + 2;
            }
          }
          else {
            u.ublessed = u.ublessed + 1;
          }
        }
        else {
          verbalize("Thy selfless generosity is deeply appreciated.");
          lVar6 = money_cnt(invent);
          if ((SBORROW8(lVar6,lVar5 * 2) != lVar6 + lVar5 * -2 < 0) && (bVar1 != '\0')) {
            if ((bVar8) && (5000 < moves - u.ucleansed)) {
              u.ualign.record = 0;
              u.ucleansed = moves;
            }
            else {
              adjalign(2);
            }
          }
        }
      }
    }
    else {
      verbalize("Begone!  Thou desecratest this holy place with thy presence.");
      *(uint *)&priest->field_0x60 = *(uint *)&priest->field_0x60 & 0xffbfffff;
    }
  }
  return;
}

Assistant:

void priest_talk(struct monst *priest)
{
	boolean coaligned = p_coaligned(priest);
	boolean strayed = (u.ualign.record < 0);

	/* KMH, conduct */
	u.uconduct.gnostic++;

	if (priest->mflee || (!priest->ispriest && coaligned && strayed)) {
	    pline("%s doesn't want anything to do with you!",
				Monnam(priest));
	    priest->mpeaceful = 0;
	    return;
	}

	/* priests don't chat unless peaceful and in their own temple */
	if (!histemple_at(priest,priest->mx,priest->my) ||
		 !priest->mpeaceful || !priest->mcanmove || priest->msleeping) {
	    static const char *const cranky_msg[3] = {
		"Thou wouldst have words, eh?  I'll give thee a word or two!",
		"Talk?  Here is what I have to say!",
		"Pilgrim, I would speak no longer with thee."
	    };

	    if (!priest->mcanmove || priest->msleeping) {
		pline("%s breaks out of %s reverie!",
		      Monnam(priest), mhis(level, priest));
		priest->mfrozen = priest->msleeping = 0;
		priest->mcanmove = 1;
	    }
	    priest->mpeaceful = 0;
	    verbalize(cranky_msg[rn2(3)]);
	    return;
	}

	/* you desecrated the temple and now you want to chat? */
	if (priest->mpeaceful && *in_rooms(level, priest->mx, priest->my, TEMPLE) &&
		  !has_shrine(priest)) {
	    verbalize("Begone!  Thou desecratest this holy place with thy presence.");
	    priest->mpeaceful = 0;
	    return;
	}
	if (!money_cnt(invent)) {
	    if (coaligned && !strayed) {
                long pmoney = money_cnt(priest->minvent);
		if (pmoney > 0L) {
		    /* Note: two bits is actually 25 cents.  Hmm. */
		    pline("%s gives you %s for an ale.", Monnam(priest),
			(pmoney == 1L) ? "one bit" : "two bits");
		     money2u(priest, pmoney > 1L ? 2 : 1);
		} else
		    pline("%s preaches the virtues of poverty.", Monnam(priest));
		exercise(A_WIS, TRUE);
	    } else
		pline("%s is not interested.", Monnam(priest));
	    return;
	} else {
	    long offer;

	    pline("%s asks you for a contribution for the temple.",
			Monnam(priest));
	    if ((offer = bribe(priest)) == 0) {
		verbalize("Thou shalt regret thine action!");
		if (coaligned) adjalign(-1);
	    } else if (offer < (u.ulevel * 200)) {
		if (money_cnt(invent) > (offer * 2L)) verbalize("Cheapskate.");
		else {
		    verbalize("I thank thee for thy contribution.");
		    /*  give player some token  */
		    exercise(A_WIS, TRUE);
		}
	    } else if (offer < (u.ulevel * 400)) {
		verbalize("Thou art indeed a pious individual.");
		if (money_cnt(invent) < (offer * 2L)) {
		    if (coaligned && u.ualign.record <= ALGN_SINNED)
			adjalign(1);
		    verbalize("I bestow upon thee a blessing.");
		    incr_itimeout(&HClairvoyant, rn1(500,500));
		}
	    } else if (offer < (u.ulevel * 600) &&
		      u.ublessed < 20 &&
		      (u.ublessed < 9 || !rn2(u.ublessed))) {
		verbalize("Thy devotion has been rewarded.");
		if (!(HProtection & INTRINSIC))  {
			HProtection |= FROMOUTSIDE;
			if (!u.ublessed)  u.ublessed = rn1(3, 2);
		} else u.ublessed++;
	    } else {
		verbalize("Thy selfless generosity is deeply appreciated.");
		if (money_cnt(invent) < (offer * 2L) && coaligned) {
		    if (strayed && (moves - u.ucleansed) > 5000L) {
			u.ualign.record = 0; /* cleanse thee */
			u.ucleansed = moves;
		    } else {
			adjalign(2);
		    }
		}
	    }
	}
}